

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  string *filename_local;
  ScopePool *this_local;
  
  __first = std::vector<cmFileLock,_std::allocator<cmFileLock>_>::begin(&this->Locks);
  __last = std::vector<cmFileLock,_std::allocator<cmFileLock>_>::end(&this->Locks);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<cmFileLock_const*,std::vector<cmFileLock,std::allocator<cmFileLock>>>,cmFileLockPool::ScopePool::IsAlreadyLocked(std::__cxx11::string_const&)const::__0>
                    ((__normal_iterator<const_cmFileLock_*,_std::vector<cmFileLock,_std::allocator<cmFileLock>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_cmFileLock_*,_std::vector<cmFileLock,_std::allocator<cmFileLock>_>_>
                      )__last._M_current,(anon_class_8_1_bc207785_for__M_pred)filename);
  return bVar1;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
  const std::string& filename) const
{
  return std::any_of(this->Locks.begin(), this->Locks.end(),
                     [&filename](cmFileLock const& lock) -> bool {
                       return lock.IsLocked(filename);
                     });
}